

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O1

bool google::ParseNumber(State *state,int *number_out)

{
  byte *pbVar1;
  int iVar2;
  byte *pbVar3;
  int iVar4;
  byte bVar5;
  
  iVar2 = 1;
  if (*state->mangled_cur == 'n') {
    state->mangled_cur = state->mangled_cur + 1;
    iVar2 = -1;
  }
  pbVar1 = (byte *)state->mangled_cur;
  bVar5 = *pbVar1;
  iVar4 = 0;
  pbVar3 = pbVar1;
  if ((byte)(bVar5 - 0x30) < 10) {
    iVar4 = 0;
    do {
      iVar4 = (uint)bVar5 + iVar4 * 10 + -0x30;
      bVar5 = pbVar3[1];
      pbVar3 = pbVar3 + 1;
    } while ((byte)(bVar5 - 0x30) < 10);
  }
  if ((pbVar3 != pbVar1) && (state->mangled_cur = (char *)pbVar3, number_out != (int *)0x0)) {
    *number_out = iVar4 * iVar2;
  }
  return pbVar3 != pbVar1;
}

Assistant:

static bool ParseOneCharToken(State *state, const char one_char_token) {
  if (state->mangled_cur[0] == one_char_token) {
    ++state->mangled_cur;
    return true;
  }
  return false;
}